

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::DescriptorScriptPubKeyMan::CanUpdateToWalletDescriptor
          (DescriptorScriptPubKeyMan *this,WalletDescriptor *descriptor,string *error)

{
  bool bVar1;
  int iVar2;
  int *in_R8;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock81;
  int local_5c;
  unique_lock<std::recursive_mutex> local_58;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_58._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_58);
  bVar1 = HasWalletDescriptor(this,descriptor);
  if (bVar1) {
    if ((this->m_wallet_descriptor).range_start < descriptor->range_start) {
      iVar2 = (this->m_wallet_descriptor).range_end;
    }
    else {
      iVar2 = (this->m_wallet_descriptor).range_end;
      bVar1 = true;
      if (iVar2 <= descriptor->range_end) goto LAB_004f4eea;
    }
    local_5c = iVar2 + -1;
    tinyformat::format<int,int>
              (&local_48,(tinyformat *)"new range must include current range = [%d,%d]",
               (char *)&(this->m_wallet_descriptor).range_start,&local_5c,in_R8);
    CanUpdateToWalletDescriptor();
    bVar1 = false;
  }
  else {
    bVar1 = false;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (error,0,error->_M_string_length,"can only update matching descriptor",0x23);
  }
LAB_004f4eea:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool DescriptorScriptPubKeyMan::CanUpdateToWalletDescriptor(const WalletDescriptor& descriptor, std::string& error)
{
    LOCK(cs_desc_man);
    if (!HasWalletDescriptor(descriptor)) {
        error = "can only update matching descriptor";
        return false;
    }

    if (descriptor.range_start > m_wallet_descriptor.range_start ||
        descriptor.range_end < m_wallet_descriptor.range_end) {
        // Use inclusive range for error
        error = strprintf("new range must include current range = [%d,%d]",
                          m_wallet_descriptor.range_start,
                          m_wallet_descriptor.range_end - 1);
        return false;
    }

    return true;
}